

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear_glfw_gl2.h
# Opt level: O1

void nk_glfw3_new_frame(void)

{
  nk_key *pnVar1;
  GLFWwindow *handle;
  int iVar2;
  uint uVar3;
  long lVar4;
  double x;
  double y;
  double local_58;
  double local_50;
  double local_48;
  undefined8 uStack_40;
  double local_38;
  undefined8 uStack_30;
  
  handle = glfw.win;
  glfwGetWindowSize(glfw.win,&glfw.width,&glfw.height);
  glfwGetFramebufferSize(handle,&glfw.display_width,&glfw.display_height);
  glfw.fb_scale.x = (float)glfw.display_width / (float)glfw.width;
  glfw.fb_scale.y = (float)glfw.display_height / (float)glfw.height;
  nk_input_begin(&glfw.ctx);
  if (0 < glfw.text_len) {
    lVar4 = 0;
    do {
      nk_utf_encode(glfw.text[lVar4],(char *)&local_58,4);
      nk_input_glyph(&glfw.ctx,(char *)&local_58);
      lVar4 = lVar4 + 1;
    } while (lVar4 < glfw.text_len);
  }
  iVar2 = 0x34002;
  if ((glfw.ctx.input.mouse.grab != '\0') || (iVar2 = 0x34001, glfw.ctx.input.mouse.ungrab != '\0'))
  {
    glfwSetInputMode(glfw.win,0x33001,iVar2);
  }
  iVar2 = glfwGetKey(handle,0x105);
  glfw.ctx.input.keyboard.keys[3].down = (int)(iVar2 == 1);
  glfw.ctx.input.keyboard.keys[3].clicked = glfw.ctx.input.keyboard.keys[3].clicked + 1;
  iVar2 = glfwGetKey(handle,0x101);
  glfw.ctx.input.keyboard.keys[4].down = (int)(iVar2 == 1);
  glfw.ctx.input.keyboard.keys[4].clicked = glfw.ctx.input.keyboard.keys[4].clicked + 1;
  iVar2 = glfwGetKey(handle,0x102);
  glfw.ctx.input.keyboard.keys[5].down = (int)(iVar2 == 1);
  glfw.ctx.input.keyboard.keys[5].clicked = glfw.ctx.input.keyboard.keys[5].clicked + 1;
  iVar2 = glfwGetKey(handle,0x103);
  glfw.ctx.input.keyboard.keys[6].down = (int)(iVar2 == 1);
  glfw.ctx.input.keyboard.keys[6].clicked = glfw.ctx.input.keyboard.keys[6].clicked + 1;
  iVar2 = glfwGetKey(handle,0x109);
  glfw.ctx.input.keyboard.keys[10].down = (int)(iVar2 == 1);
  glfw.ctx.input.keyboard.keys[10].clicked = glfw.ctx.input.keyboard.keys[10].clicked + 1;
  iVar2 = glfwGetKey(handle,0x108);
  glfw.ctx.input.keyboard.keys[0xb].down = (int)(iVar2 == 1);
  glfw.ctx.input.keyboard.keys[0xb].clicked = glfw.ctx.input.keyboard.keys[0xb].clicked + 1;
  iVar2 = glfwGetKey(handle,0x10c);
  glfw.ctx.input.keyboard.keys[0x13].down = (int)(iVar2 == 1);
  glfw.ctx.input.keyboard.keys[0x13].clicked = glfw.ctx.input.keyboard.keys[0x13].clicked + 1;
  iVar2 = glfwGetKey(handle,0x10d);
  glfw.ctx.input.keyboard.keys[0x14].down = (int)(iVar2 == 1);
  glfw.ctx.input.keyboard.keys[0x14].clicked = glfw.ctx.input.keyboard.keys[0x14].clicked + 1;
  iVar2 = glfwGetKey(handle,0x10c);
  glfw.ctx.input.keyboard.keys[0x1a].down = (int)(iVar2 == 1);
  glfw.ctx.input.keyboard.keys[0x1a].clicked = glfw.ctx.input.keyboard.keys[0x1a].clicked + 1;
  iVar2 = glfwGetKey(handle,0x10d);
  glfw.ctx.input.keyboard.keys[0x1b].down = (int)(iVar2 == 1);
  glfw.ctx.input.keyboard.keys[0x1b].clicked = glfw.ctx.input.keyboard.keys[0x1b].clicked + 1;
  iVar2 = glfwGetKey(handle,0x10b);
  glfw.ctx.input.keyboard.keys[0x1c].down = (int)(iVar2 == 1);
  glfw.ctx.input.keyboard.keys[0x1c].clicked = glfw.ctx.input.keyboard.keys[0x1c].clicked + 1;
  iVar2 = glfwGetKey(handle,0x10a);
  glfw.ctx.input.keyboard.keys[0x1d].down = (int)(iVar2 == 1);
  glfw.ctx.input.keyboard.keys[0x1d].clicked = glfw.ctx.input.keyboard.keys[0x1d].clicked + 1;
  iVar2 = glfwGetKey(handle,0x154);
  uVar3 = 1;
  if (iVar2 != 1) {
    iVar2 = glfwGetKey(handle,0x158);
    uVar3 = (uint)(iVar2 == 1);
  }
  glfw.ctx.input.keyboard.keys[1].clicked = glfw.ctx.input.keyboard.keys[1].clicked + 1;
  glfw.ctx.input.keyboard.keys[1].down = uVar3;
  iVar2 = glfwGetKey(handle,0x155);
  if (iVar2 != 1) {
    iVar2 = glfwGetKey(handle,0x159);
    if (iVar2 != 1) {
      iVar2 = glfwGetKey(handle,0x107);
      glfw.ctx.input.keyboard.keys[0xc].down = (int)(iVar2 == 1);
      glfw.ctx.input.keyboard.keys[0xc].clicked = glfw.ctx.input.keyboard.keys[0xc].clicked + 1;
      iVar2 = glfwGetKey(handle,0x106);
      glfw.ctx.input.keyboard.keys[0xd].down = (int)(iVar2 == 1);
      glfw.ctx.input.keyboard.keys[0xd].clicked = glfw.ctx.input.keyboard.keys[0xd].clicked + 1;
      glfw.ctx.input.keyboard.keys[7].down = 0;
      glfw.ctx.input.keyboard.keys[7].clicked = glfw.ctx.input.keyboard.keys[7].clicked + 1;
      glfw.ctx.input.keyboard.keys[9].down = 0;
      glfw.ctx.input.keyboard.keys[9].clicked = glfw.ctx.input.keyboard.keys[9].clicked + 1;
      glfw.ctx.input.keyboard.keys[8].down = 0;
      glfw.ctx.input.keyboard.keys[8].clicked = glfw.ctx.input.keyboard.keys[8].clicked + 1;
      glfw.ctx.input.keyboard.keys[1].down = 0;
      pnVar1 = glfw.ctx.input.keyboard.keys + 1;
      goto LAB_0013bf58;
    }
  }
  iVar2 = glfwGetKey(handle,0x43);
  glfw.ctx.input.keyboard.keys[7].down = (int)(iVar2 == 1);
  glfw.ctx.input.keyboard.keys[7].clicked = glfw.ctx.input.keyboard.keys[7].clicked + 1;
  iVar2 = glfwGetKey(handle,0x56);
  glfw.ctx.input.keyboard.keys[9].down = (int)(iVar2 == 1);
  glfw.ctx.input.keyboard.keys[9].clicked = glfw.ctx.input.keyboard.keys[9].clicked + 1;
  iVar2 = glfwGetKey(handle,0x58);
  glfw.ctx.input.keyboard.keys[8].down = (int)(iVar2 == 1);
  glfw.ctx.input.keyboard.keys[8].clicked = glfw.ctx.input.keyboard.keys[8].clicked + 1;
  iVar2 = glfwGetKey(handle,0x5a);
  glfw.ctx.input.keyboard.keys[0x15].down = (int)(iVar2 == 1);
  glfw.ctx.input.keyboard.keys[0x15].clicked = glfw.ctx.input.keyboard.keys[0x15].clicked + 1;
  iVar2 = glfwGetKey(handle,0x52);
  glfw.ctx.input.keyboard.keys[0x16].down = (int)(iVar2 == 1);
  glfw.ctx.input.keyboard.keys[0x16].clicked = glfw.ctx.input.keyboard.keys[0x16].clicked + 1;
  iVar2 = glfwGetKey(handle,0x107);
  glfw.ctx.input.keyboard.keys[0x18].down = (int)(iVar2 == 1);
  glfw.ctx.input.keyboard.keys[0x18].clicked = glfw.ctx.input.keyboard.keys[0x18].clicked + 1;
  iVar2 = glfwGetKey(handle,0x106);
  glfw.ctx.input.keyboard.keys[0x19].down = (int)(iVar2 == 1);
  glfw.ctx.input.keyboard.keys[0x19].clicked = glfw.ctx.input.keyboard.keys[0x19].clicked + 1;
  iVar2 = glfwGetKey(handle,0x42);
  glfw.ctx.input.keyboard.keys[0x11].down = (int)(iVar2 == 1);
  glfw.ctx.input.keyboard.keys[0x11].clicked = glfw.ctx.input.keyboard.keys[0x11].clicked + 1;
  iVar2 = glfwGetKey(handle,0x45);
  glfw.ctx.input.keyboard.keys[0x12].down = (int)(iVar2 == 1);
  pnVar1 = glfw.ctx.input.keyboard.keys + 0x12;
LAB_0013bf58:
  pnVar1->clicked = pnVar1->clicked + 1;
  glfwGetCursorPos(handle,&local_58,&local_50);
  glfw.ctx.input.mouse.pos.y = (float)(int)local_50;
  glfw.ctx.input.mouse.pos.x = (float)(int)local_58;
  glfw.ctx.input.mouse.delta.x = (float)(int)local_58 - glfw.ctx.input.mouse.prev.x;
  glfw.ctx.input.mouse.delta.y = (float)(int)local_50 - glfw.ctx.input.mouse.prev.y;
  if (glfw.ctx.input.mouse.grabbed != '\0') {
    glfwSetCursorPos(glfw.win,(double)glfw.ctx.input.mouse.prev.x,
                     (double)glfw.ctx.input.mouse.prev.y);
    glfw.ctx.input.mouse.pos.y = glfw.ctx.input.mouse.prev.y;
    glfw.ctx.input.mouse.pos.x = glfw.ctx.input.mouse.prev.x;
  }
  local_48 = local_58;
  uStack_40 = 0;
  local_38 = local_50;
  uStack_30 = 0;
  iVar2 = glfwGetMouseButton(handle,0);
  if (glfw.ctx.input.mouse.buttons[0].down != (uint)(iVar2 == 1)) {
    glfw.ctx.input.mouse.buttons[0].clicked_pos.x = (float)(int)local_48;
    glfw.ctx.input.mouse.buttons[0].clicked_pos.y = (float)(int)local_38;
    glfw.ctx.input.mouse.buttons[0].clicked = glfw.ctx.input.mouse.buttons[0].clicked + 1;
    glfw.ctx.input.mouse.buttons[0].down = (uint)(iVar2 == 1);
  }
  local_48 = local_58;
  uStack_40 = 0;
  local_38 = local_50;
  uStack_30 = 0;
  iVar2 = glfwGetMouseButton(handle,2);
  if (glfw.ctx.input.mouse.buttons[1].down != (uint)(iVar2 == 1)) {
    glfw.ctx.input.mouse.buttons[1].clicked_pos.x = (float)(int)local_48;
    glfw.ctx.input.mouse.buttons[1].clicked_pos.y = (float)(int)local_38;
    glfw.ctx.input.mouse.buttons[1].clicked = glfw.ctx.input.mouse.buttons[1].clicked + 1;
    glfw.ctx.input.mouse.buttons[1].down = (uint)(iVar2 == 1);
  }
  local_48 = local_58;
  uStack_40 = 0;
  local_38 = local_50;
  uStack_30 = 0;
  iVar2 = glfwGetMouseButton(handle,1);
  if (glfw.ctx.input.mouse.buttons[2].down != (uint)(iVar2 == 1)) {
    glfw.ctx.input.mouse.buttons[2].clicked_pos.x = (float)(int)local_48;
    glfw.ctx.input.mouse.buttons[2].clicked_pos.y = (float)(int)local_38;
    glfw.ctx.input.mouse.buttons[2].clicked = glfw.ctx.input.mouse.buttons[2].clicked + 1;
    glfw.ctx.input.mouse.buttons[2].down = (uint)(iVar2 == 1);
  }
  glfw.ctx.input.mouse.scroll_delta = glfw.scroll + glfw.ctx.input.mouse.scroll_delta;
  if (glfw.ctx.input.mouse.grab != '\0') {
    glfw.ctx.input.mouse._76_2_ = glfw.ctx.input.mouse._76_2_ & 0xff00;
  }
  if (glfw.ctx.input.mouse.ungrab != '\0') {
    glfw.ctx.input.mouse.ungrab = '\0';
    glfw.ctx.input.mouse.grab = '\0';
    glfw.ctx.input.mouse.grabbed = '\0';
  }
  glfw.text_len = 0;
  glfw.scroll = 0.0;
  return;
}

Assistant:

NK_API void
nk_glfw3_new_frame(void)
{
    int i;
    double x, y;
    struct nk_context *ctx = &glfw.ctx;
    struct GLFWwindow *win = glfw.win;

    glfwGetWindowSize(win, &glfw.width, &glfw.height);
    glfwGetFramebufferSize(win, &glfw.display_width, &glfw.display_height);
    glfw.fb_scale.x = (float)glfw.display_width/(float)glfw.width;
    glfw.fb_scale.y = (float)glfw.display_height/(float)glfw.height;

    nk_input_begin(ctx);
    for (i = 0; i < glfw.text_len; ++i)
        nk_input_unicode(ctx, glfw.text[i]);

    /* optional grabbing behavior */
    if (ctx->input.mouse.grab)
        glfwSetInputMode(glfw.win, GLFW_CURSOR, GLFW_CURSOR_HIDDEN);
    else if (ctx->input.mouse.ungrab)
        glfwSetInputMode(glfw.win, GLFW_CURSOR, GLFW_CURSOR_NORMAL);

    nk_input_key(ctx, NK_KEY_DEL, glfwGetKey(win, GLFW_KEY_DELETE) == GLFW_PRESS);
    nk_input_key(ctx, NK_KEY_ENTER, glfwGetKey(win, GLFW_KEY_ENTER) == GLFW_PRESS);
    nk_input_key(ctx, NK_KEY_TAB, glfwGetKey(win, GLFW_KEY_TAB) == GLFW_PRESS);
    nk_input_key(ctx, NK_KEY_BACKSPACE, glfwGetKey(win, GLFW_KEY_BACKSPACE) == GLFW_PRESS);
    nk_input_key(ctx, NK_KEY_UP, glfwGetKey(win, GLFW_KEY_UP) == GLFW_PRESS);
    nk_input_key(ctx, NK_KEY_DOWN, glfwGetKey(win, GLFW_KEY_DOWN) == GLFW_PRESS);
    nk_input_key(ctx, NK_KEY_TEXT_START, glfwGetKey(win, GLFW_KEY_HOME) == GLFW_PRESS);
    nk_input_key(ctx, NK_KEY_TEXT_END, glfwGetKey(win, GLFW_KEY_END) == GLFW_PRESS);
    nk_input_key(ctx, NK_KEY_SCROLL_START, glfwGetKey(win, GLFW_KEY_HOME) == GLFW_PRESS);
    nk_input_key(ctx, NK_KEY_SCROLL_END, glfwGetKey(win, GLFW_KEY_END) == GLFW_PRESS);
    nk_input_key(ctx, NK_KEY_SCROLL_DOWN, glfwGetKey(win, GLFW_KEY_PAGE_DOWN) == GLFW_PRESS);
    nk_input_key(ctx, NK_KEY_SCROLL_UP, glfwGetKey(win, GLFW_KEY_PAGE_UP) == GLFW_PRESS);
    nk_input_key(ctx, NK_KEY_SHIFT, glfwGetKey(win, GLFW_KEY_LEFT_SHIFT) == GLFW_PRESS||
                                    glfwGetKey(win, GLFW_KEY_RIGHT_SHIFT) == GLFW_PRESS);

    if (glfwGetKey(win, GLFW_KEY_LEFT_CONTROL) == GLFW_PRESS ||
        glfwGetKey(win, GLFW_KEY_RIGHT_CONTROL) == GLFW_PRESS) {
        nk_input_key(ctx, NK_KEY_COPY, glfwGetKey(win, GLFW_KEY_C) == GLFW_PRESS);
        nk_input_key(ctx, NK_KEY_PASTE, glfwGetKey(win, GLFW_KEY_V) == GLFW_PRESS);
        nk_input_key(ctx, NK_KEY_CUT, glfwGetKey(win, GLFW_KEY_X) == GLFW_PRESS);
        nk_input_key(ctx, NK_KEY_TEXT_UNDO, glfwGetKey(win, GLFW_KEY_Z) == GLFW_PRESS);
        nk_input_key(ctx, NK_KEY_TEXT_REDO, glfwGetKey(win, GLFW_KEY_R) == GLFW_PRESS);
        nk_input_key(ctx, NK_KEY_TEXT_WORD_LEFT, glfwGetKey(win, GLFW_KEY_LEFT) == GLFW_PRESS);
        nk_input_key(ctx, NK_KEY_TEXT_WORD_RIGHT, glfwGetKey(win, GLFW_KEY_RIGHT) == GLFW_PRESS);
        nk_input_key(ctx, NK_KEY_TEXT_LINE_START, glfwGetKey(win, GLFW_KEY_B) == GLFW_PRESS);
        nk_input_key(ctx, NK_KEY_TEXT_LINE_END, glfwGetKey(win, GLFW_KEY_E) == GLFW_PRESS);
    } else {
        nk_input_key(ctx, NK_KEY_LEFT, glfwGetKey(win, GLFW_KEY_LEFT) == GLFW_PRESS);
        nk_input_key(ctx, NK_KEY_RIGHT, glfwGetKey(win, GLFW_KEY_RIGHT) == GLFW_PRESS);
        nk_input_key(ctx, NK_KEY_COPY, 0);
        nk_input_key(ctx, NK_KEY_PASTE, 0);
        nk_input_key(ctx, NK_KEY_CUT, 0);
        nk_input_key(ctx, NK_KEY_SHIFT, 0);
    }

    glfwGetCursorPos(win, &x, &y);
    nk_input_motion(ctx, (int)x, (int)y);
    if (ctx->input.mouse.grabbed) {
        glfwSetCursorPos(glfw.win, ctx->input.mouse.prev.x, ctx->input.mouse.prev.y);
        ctx->input.mouse.pos.x = ctx->input.mouse.prev.x;
        ctx->input.mouse.pos.y = ctx->input.mouse.prev.y;
    }

    nk_input_button(ctx, NK_BUTTON_LEFT, (int)x, (int)y, glfwGetMouseButton(win, GLFW_MOUSE_BUTTON_LEFT) == GLFW_PRESS);
    nk_input_button(ctx, NK_BUTTON_MIDDLE, (int)x, (int)y, glfwGetMouseButton(win, GLFW_MOUSE_BUTTON_MIDDLE) == GLFW_PRESS);
    nk_input_button(ctx, NK_BUTTON_RIGHT, (int)x, (int)y, glfwGetMouseButton(win, GLFW_MOUSE_BUTTON_RIGHT) == GLFW_PRESS);
    nk_input_scroll(ctx, glfw.scroll);
    nk_input_end(&glfw.ctx);
    glfw.text_len = 0;
    glfw.scroll = 0;
}